

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

int av1_txfm_uvrd(AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bsize,
                 int64_t ref_best_rd)

{
  BLOCK_SIZE plane_bsize;
  MB_MODE_INFO *pMVar1;
  bool bVar2;
  TX_SIZE tx_size;
  long lVar3;
  long lVar4;
  int plane_00;
  int plane;
  int iVar5;
  long lVar6;
  RD_STATS this_rd_stats;
  
  rd_stats->rate = 0;
  rd_stats->zero_rate = 0;
  rd_stats->sse = 0;
  rd_stats->dist = 0;
  rd_stats->rdcost = 0;
  rd_stats->skip_txfm = '\x01';
  if (-1 < ref_best_rd) {
    if ((x->e_mbd).is_chroma_ref != true) {
      return 1;
    }
    pMVar1 = *(x->e_mbd).mi;
    bVar2 = true;
    if ((pMVar1->field_0xa7 & 0x80) == 0) {
      bVar2 = '\0' < pMVar1->ref_frame[0];
    }
    plane_bsize = av1_ss_size_lookup[bsize][(x->e_mbd).plane[1].subsampling_x]
                  [(x->e_mbd).plane[1].subsampling_y];
    if (bVar2) {
      for (iVar5 = 1; iVar5 != 3; iVar5 = iVar5 + 1) {
        av1_subtract_plane(x,plane_bsize,iVar5);
      }
    }
    tx_size = av1_get_tx_size(1,&x->e_mbd);
    lVar3 = 0;
    lVar4 = 0;
    iVar5 = 1;
    do {
      plane_00 = iVar5;
      if (plane_00 == 3) {
        iVar5 = 1;
        goto LAB_0021f0b2;
      }
      if (lVar4 < lVar3) {
        lVar3 = lVar4;
      }
      if ((cpi->sf).inter_sf.perform_best_rd_based_gating_for_chroma == 0) {
        lVar3 = 0;
      }
      if (ref_best_rd == 0x7fffffffffffffff) {
        lVar3 = 0;
      }
      if (!bVar2) {
        lVar3 = 0;
      }
      av1_txfm_rd_in_plane
                (x,cpi,&this_rd_stats,ref_best_rd - lVar3,0,plane_00,plane_bsize,tx_size,'\0',0);
      if (this_rd_stats.rate == 0x7fffffff) goto LAB_0021f0b7;
      av1_merge_rd_stats(rd_stats,&this_rd_stats);
      lVar4 = rd_stats->dist * 0x80 + ((long)x->rdmult * (long)rd_stats->rate + 0x100 >> 9);
      lVar3 = rd_stats->sse * 0x80;
      lVar6 = lVar3;
      if (lVar4 < lVar3) {
        lVar6 = lVar4;
      }
      iVar5 = plane_00 + 1;
    } while (lVar6 <= ref_best_rd);
    iVar5 = 0;
LAB_0021f0b2:
    if (plane_00 == 3) {
      return iVar5;
    }
LAB_0021f0b7:
    rd_stats->rate = 0x7fffffff;
    rd_stats->zero_rate = 0;
    rd_stats->dist = 0x7fffffffffffffff;
    rd_stats->rdcost = 0x7fffffffffffffff;
    rd_stats->sse = 0x7fffffffffffffff;
    rd_stats->skip_txfm = '\0';
  }
  return 0;
}

Assistant:

int av1_txfm_uvrd(const AV1_COMP *const cpi, MACROBLOCK *x, RD_STATS *rd_stats,
                  BLOCK_SIZE bsize, int64_t ref_best_rd) {
  av1_init_rd_stats(rd_stats);
  if (ref_best_rd < 0) return 0;
  if (!x->e_mbd.is_chroma_ref) return 1;

  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_U];
  const int is_inter = is_inter_block(mbmi);
  int64_t this_rd = 0, skip_txfm_rd = 0;
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);

  if (is_inter) {
    for (int plane = 1; plane < MAX_MB_PLANE; ++plane)
      av1_subtract_plane(x, plane_bsize, plane);
  }

  const int skip_trellis = 0;
  const TX_SIZE uv_tx_size = av1_get_tx_size(AOM_PLANE_U, xd);
  int is_cost_valid = 1;
  for (int plane = 1; plane < MAX_MB_PLANE; ++plane) {
    RD_STATS this_rd_stats;
    int64_t chroma_ref_best_rd = ref_best_rd;
    // For inter blocks, refined ref_best_rd is used for early exit
    // For intra blocks, even though current rd crosses ref_best_rd, early
    // exit is not recommended as current rd is used for gating subsequent
    // modes as well (say, for angular modes)
    // TODO(any): Extend the early exit mechanism for intra modes as well
    if (cpi->sf.inter_sf.perform_best_rd_based_gating_for_chroma && is_inter &&
        chroma_ref_best_rd != INT64_MAX)
      chroma_ref_best_rd = ref_best_rd - AOMMIN(this_rd, skip_txfm_rd);
    av1_txfm_rd_in_plane(x, cpi, &this_rd_stats, chroma_ref_best_rd, 0, plane,
                         plane_bsize, uv_tx_size, FTXS_NONE, skip_trellis);
    if (this_rd_stats.rate == INT_MAX) {
      is_cost_valid = 0;
      break;
    }
    av1_merge_rd_stats(rd_stats, &this_rd_stats);
    this_rd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
    skip_txfm_rd = RDCOST(x->rdmult, 0, rd_stats->sse);
    if (AOMMIN(this_rd, skip_txfm_rd) > ref_best_rd) {
      is_cost_valid = 0;
      break;
    }
  }

  if (!is_cost_valid) {
    // reset cost value
    av1_invalid_rd_stats(rd_stats);
  }

  return is_cost_valid;
}